

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlStringGetNodeList(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_50;
  undefined8 local_48;
  xmlChar *value;
  PyObject *pyobj_doc;
  xmlDoc *doc;
  xmlNodePtr c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"Oz:xmlStringGetNodeList",&value,&local_48);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (value == &_Py_NoneStruct) {
      local_50 = (PyObject *)0x0;
    }
    else {
      local_50 = *(PyObject **)(value + 0x10);
    }
    pyobj_doc = local_50;
    doc = (xmlDoc *)xmlStringGetNodeList(local_50,local_48);
    self_local = libxml_xmlNodePtrWrap((xmlNodePtr)doc);
  }
  return self_local;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlStringGetNodeList(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlNodePtr c_retval;
    xmlDoc * doc;
    PyObject *pyobj_doc;
    xmlChar * value;

    if (!PyArg_ParseTuple(args, (char *)"Oz:xmlStringGetNodeList", &pyobj_doc, &value))
        return(NULL);
    doc = (xmlDoc *) PyxmlNode_Get(pyobj_doc);

    c_retval = xmlStringGetNodeList(doc, value);
    py_retval = libxml_xmlNodePtrWrap((xmlNodePtr) c_retval);
    return(py_retval);
}